

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O3

bool dxil_spv::emit_load_input_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  bool bVar2;
  bool bVar3;
  Id IVar4;
  Id IVar5;
  uint uVar6;
  ValueKind VVar7;
  Builder *pBVar8;
  iterator iVar9;
  Operation *pOVar10;
  const_iterator cVar11;
  Value *pVVar12;
  Constant *this;
  APInt *this_00;
  uint64_t uVar13;
  LoggingCallback p_Var14;
  void *pvVar15;
  mapped_type *pmVar16;
  Op OVar17;
  uint32_t input_element_index;
  BuiltIn builtin_1;
  BuiltIn builtin;
  uint32_t local_1068;
  Id local_1064;
  CallInst *local_1060;
  mapped_type *local_1058;
  uint local_1050;
  BuiltIn local_104c;
  Value *local_1048;
  Id local_1040;
  Id local_103c;
  initializer_list<unsigned_int> local_1038;
  undefined5 uStack_1028;
  char acStack_1023 [4083];
  
  pBVar8 = Converter::Impl::builder(impl);
  bVar2 = get_constant_operand(&instruction->super_Instruction,1,&local_1068);
  if (!bVar2) {
    return bVar2;
  }
  local_1038._M_array = (iterator)CONCAT44(local_1038._M_array._4_4_,local_1068);
  iVar9 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ClipCullMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ClipCullMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(impl->input_clip_cull_meta)._M_h,(key_type *)&local_1038);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ClipCullMeta>,_false>
      ._M_cur != (__node_type *)0x0) {
    IVar4 = get_clip_cull_distance_access_chain
                      (impl,instruction,
                       (ClipCullMeta *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ClipCullMeta>,_false>
                              ._M_cur + 0xc),StorageClassInput);
    pOVar10 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction);
    Operation::add_id(pOVar10,IVar4);
    Converter::Impl::add(impl,pOVar10,false);
    return bVar2;
  }
  local_1060 = instruction;
  local_1058 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->input_elements_meta,&local_1068);
  IVar4 = local_1058->id;
  IVar5 = spv::Builder::getDerefTypeId(pBVar8,IVar4);
  if ((impl->execution_model - ExecutionModelTessellationControl < 3) ||
     (cVar11 = std::
               _Hashtable<unsigned_int,_unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&(impl->llvm_attribute_at_vertex_indices)._M_h,&local_1068),
     cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)) {
    IVar5 = spv::Builder::getContainedTypeId(pBVar8,IVar5);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  OVar17 = (pBVar8->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[IVar5]->opCode & ~OpUndef;
  if (OVar17 == OpTypeArray) {
    IVar5 = spv::Builder::getContainedTypeId(pBVar8,IVar5);
  }
  uVar6 = spv::Builder::getNumTypeConstituents(pBVar8,IVar5);
  local_1064 = IVar4;
  if ((bool)(1 < uVar6 | bVar3 | OVar17 == OpTypeArray)) {
    local_1050 = uVar6;
    IVar5 = Converter::Impl::get_effective_input_output_type_id(impl,local_1058->component_type);
    IVar5 = spv::Builder::makePointer(pBVar8,StorageClassInput,IVar5);
    pOVar10 = Converter::Impl::allocate(impl,OpAccessChain,IVar5);
    local_1064 = pOVar10->id;
    Operation::add_id(pOVar10,IVar4);
    pCVar1 = local_1060;
    if (bVar3) {
      local_1048 = LLVMBC::Instruction::getOperand(&local_1060->super_Instruction,4);
      pVVar12 = LLVMBC::Internal::resolve_proxy(local_1048);
      VVar7 = LLVMBC::Value::get_value_kind(pVVar12);
      if (VVar7 == Undef) {
        IVar5 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
        IVar5 = spv::Builder::makeIntConstant(pBVar8,IVar5,0,false);
      }
      else {
        IVar5 = Converter::Impl::get_id_for_value(impl,local_1048,0);
      }
      Operation::add_id(pOVar10,IVar5);
    }
    if (OVar17 == OpTypeArray) {
      pVVar12 = LLVMBC::Instruction::getOperand(&pCVar1->super_Instruction,2);
      IVar5 = Converter::Impl::get_id_for_value(impl,pVVar12,0);
      Operation::add_id(pOVar10,IVar5);
    }
    if (1 < local_1050) {
      pVVar12 = LLVMBC::Instruction::getOperand(&pCVar1->super_Instruction,3);
      IVar5 = Converter::Impl::get_id_for_value(impl,pVVar12,0x20);
      Operation::add_id(pOVar10,IVar5);
    }
    Converter::Impl::add(impl,pOVar10,false);
  }
  pmVar16 = local_1058;
  bVar3 = SPIRVModule::query_builtin_shader_input
                    (impl->spirv_module,local_1058->id,(BuiltIn *)&local_1038);
  if ((bVar3) && ((int)local_1038._M_array == 0x11)) {
    pBVar8 = Converter::Impl::builder(impl);
    IVar5 = spv::Builder::makeBoolType(pBVar8);
  }
  else {
    IVar5 = Converter::Impl::get_effective_input_output_type_id(impl,pmVar16->component_type);
  }
  pCVar1 = local_1060;
  pOVar10 = Converter::Impl::allocate(impl,OpLoad,(Value *)local_1060,IVar5);
  Operation::add_id(pOVar10,local_1064);
  Converter::Impl::add(impl,pOVar10,false);
  pBVar8 = Converter::Impl::builder(impl);
  bVar3 = SPIRVModule::query_builtin_shader_input(impl->spirv_module,IVar4,&local_104c);
  if (bVar3) {
    if ((local_104c & ~BuiltInPointSize) == BuiltInVertexIndex) {
      IVar4 = SPIRVModule::get_builtin_shader_input
                        (impl->spirv_module,local_104c == BuiltInInstanceIndex | BuiltInBaseVertex);
      IVar5 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
      pOVar10 = Converter::Impl::allocate(impl,OpLoad,IVar5);
      Operation::add_id(pOVar10,IVar4);
      IVar4 = pOVar10->id;
      Converter::Impl::add(impl,pOVar10,false);
      IVar5 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
      pOVar10 = Converter::Impl::allocate(impl,OpISub,IVar5);
      local_1040 = Converter::Impl::get_id_for_value(impl,(Value *)pCVar1,0);
      local_1038._M_array = &local_1040;
      local_1038._M_len._0_5_ = 2;
      local_1038._M_len._5_3_ = 0;
      local_103c = IVar4;
      Operation::add_ids(pOVar10,&local_1038);
      Converter::Impl::add(impl,pOVar10,false);
      Converter::Impl::rewrite_value(impl,(Value *)pCVar1,pOVar10->id);
      pmVar16 = local_1058;
      local_1038._M_array = (iterator)CONCAT44(local_1038._M_array._4_4_,0x114b);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar8->capabilities,(Capability *)&local_1038);
    }
    else {
      if (local_104c == BuiltInFragCoord) {
        pVVar12 = LLVMBC::Instruction::getOperand(&pCVar1->super_Instruction,3);
        this = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar12);
        VVar7 = LLVMBC::Value::get_value_kind((Value *)this);
        if (VVar7 != ConstantInt) {
          p_Var14 = get_thread_log_callback();
          if (p_Var14 != (LoggingCallback)0x0) {
            uStack_1028 = 0x6163206e69;
            builtin_strncpy(acStack_1023,"st<T>.\n",8);
            local_1038._M_array = (iterator)0x2064696c61766e49;
            local_1038._M_len._0_5_ = 0x2065707974;
            local_1038._M_len._5_3_ = 0x204449;
            pvVar15 = get_thread_log_callback_userdata();
            (*p_Var14)(pvVar15,Error,(char *)&local_1038);
            std::terminate();
          }
          emit_load_input_instruction();
          std::terminate();
        }
        this_00 = LLVMBC::Constant::getUniqueInteger(this);
        uVar13 = LLVMBC::APInt::getZExtValue(this_00);
        if (uVar13 != 3) goto LAB_0015d42e;
        IVar4 = spv::Builder::makeFloatType(pBVar8,0x20);
        pOVar10 = Converter::Impl::allocate(impl,OpFDiv,IVar4);
        IVar4 = spv::Builder::makeFloatConstant(pBVar8,1.0,false);
        Operation::add_id(pOVar10,IVar4);
        IVar4 = Converter::Impl::get_id_for_value(impl,(Value *)pCVar1,0);
      }
      else {
        if (local_104c != BuiltInFrontFacing) goto LAB_0015d42e;
        IVar4 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
        pOVar10 = Converter::Impl::allocate(impl,OpSelect,IVar4);
        IVar4 = Converter::Impl::get_id_for_value(impl,(Value *)pCVar1,0);
        Operation::add_id(pOVar10,IVar4);
        IVar4 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
        IVar4 = spv::Builder::makeIntConstant(pBVar8,IVar4,0xffffffff,false);
        Operation::add_id(pOVar10,IVar4);
        IVar4 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
        IVar4 = spv::Builder::makeIntConstant(pBVar8,IVar4,0,false);
      }
      Operation::add_id(pOVar10,IVar4);
      Converter::Impl::add(impl,pOVar10,false);
      Converter::Impl::rewrite_value(impl,(Value *)pCVar1,pOVar10->id);
    }
  }
LAB_0015d42e:
  Converter::Impl::fixup_load_type_io(impl,pmVar16->component_type,1,(Value *)pCVar1);
  return bVar2;
}

Assistant:

bool emit_load_input_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t input_element_index;
	if (!get_constant_operand(instruction, 1, &input_element_index))
		return false;

	// Need special handling for clip distance.
	auto *clip_cull_meta = input_clip_cull_distance_meta(impl, input_element_index);
	if (clip_cull_meta)
		return emit_load_clip_cull_distance(impl, instruction, *clip_cull_meta);

	const auto &meta = impl.input_elements_meta[input_element_index];
	uint32_t var_id = meta.id;
	uint32_t ptr_id;

	spv::Id input_type_id = builder.getDerefTypeId(var_id);

	bool array_index = false;
	if (impl.execution_model == spv::ExecutionModelTessellationControl ||
	    impl.execution_model == spv::ExecutionModelGeometry ||
	    impl.execution_model == spv::ExecutionModelTessellationEvaluation ||
	    impl.llvm_attribute_at_vertex_indices.count(input_element_index) != 0)
	{
		input_type_id = builder.getContainedTypeId(input_type_id);
		array_index = true;
	}

	bool row_index = false;
	if (builder.isArrayType(input_type_id))
	{
		row_index = true;
		input_type_id = builder.getContainedTypeId(input_type_id);
	}

	uint32_t num_cols = builder.getNumTypeComponents(input_type_id);

	if (num_cols > 1 || row_index || array_index)
	{
		// Need to deal with signed vs unsigned here.
		Operation *op =
			impl.allocate(spv::OpAccessChain,
			              builder.makePointer(spv::StorageClassInput,
			                                  impl.get_effective_input_output_type_id(meta.component_type)));
		ptr_id = op->id;

		op->add_id(var_id);
		// Vertex array index for GS/DS/HS or barycentrics.
		if (array_index)
		{
			auto *index = instruction->getOperand(4);
			if (llvm::isa<llvm::UndefValue>(index))
			{
				// If we loadInput on a barycentric input, we get nointerpolation,
				// i.e. flat, i.e. provoking vertex, i.e. vertex 0.
				op->add_id(builder.makeUintConstant(0));
			}
			else
				op->add_id(impl.get_id_for_value(index));
		}
		if (row_index)
			op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
		if (num_cols > 1)
			op->add_id(impl.get_id_for_value(instruction->getOperand(3), 32));

		impl.add(op);
	}
	else
		ptr_id = var_id;

	// Need to deal with signed vs unsigned here.
	spv::Id load_type = get_builtin_load_type(impl, meta);

	Operation *op = impl.allocate(spv::OpLoad, instruction, load_type);
	op->add_id(ptr_id);
	impl.add(op);

	fixup_builtin_load(impl, var_id, instruction);

	// Need to bitcast after we load.
	impl.fixup_load_type_io(meta.component_type, 1, instruction);
	return true;
}